

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O3

size_t mpp_buf_slot_get_size(MppBufSlots slots)

{
  pthread_mutex_t *__mutex;
  size_t sVar1;
  
  if (slots == (MppBufSlots)0x0) {
    sVar1 = 0;
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_get_size");
  }
  else {
    __mutex = *slots;
    if (__mutex == (pthread_mutex_t *)0x0) {
      sVar1 = *(size_t *)((long)slots + 0x58);
    }
    else {
      pthread_mutex_lock(__mutex);
      sVar1 = *(size_t *)((long)slots + 0x58);
      pthread_mutex_unlock(__mutex);
    }
  }
  return sVar1;
}

Assistant:

size_t mpp_buf_slot_get_size(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return 0;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    return impl->buf_size;
}